

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O1

void first_pass_intra_pred_and_calc_diff
               (int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,TX_SIZE tx_size,
               void *arg)

{
  int dst_stride;
  int ref_stride;
  MACROBLOCK *x;
  
  x = *(MACROBLOCK **)((long)arg + 8);
  dst_stride = (x->e_mbd).plane[plane].dst.stride;
  ref_stride = x->plane[plane].src.stride;
  av1_predict_intra_block
            (&x->e_mbd,*(BLOCK_SIZE *)(*arg + 0x1c),(uint)*(byte *)(*arg + 0x3d),
             (uint)(x->e_mbd).plane[plane].width,(uint)(x->e_mbd).plane[plane].height,tx_size,
             (*(x->e_mbd).mi)->mode,0,0,'\x05',
             x->plane[plane].src.buf + (ref_stride * blk_row + blk_col) * 4,ref_stride,
             (x->e_mbd).plane[plane].dst.buf + (dst_stride * blk_row + blk_col) * 4,dst_stride,
             blk_col,blk_row,plane);
  av1_subtract_txb(x,plane,plane_bsize,blk_col,blk_row,tx_size);
  return;
}

Assistant:

static void first_pass_intra_pred_and_calc_diff(int plane, int block,
                                                int blk_row, int blk_col,
                                                BLOCK_SIZE plane_bsize,
                                                TX_SIZE tx_size, void *arg) {
  (void)block;
  struct intra_pred_block_pass1_args *const args = arg;
  MACROBLOCK *const x = args->x;
  MACROBLOCKD *const xd = &x->e_mbd;
  MACROBLOCKD_PLANE *const pd = &xd->plane[plane];
  MACROBLOCK_PLANE *const p = &x->plane[plane];
  const int dst_stride = pd->dst.stride;
  uint8_t *dst = &pd->dst.buf[(blk_row * dst_stride + blk_col) << MI_SIZE_LOG2];
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const SequenceHeader *seq_params = args->seq_params;
  const int src_stride = p->src.stride;
  uint8_t *src = &p->src.buf[(blk_row * src_stride + blk_col) << MI_SIZE_LOG2];

  av1_predict_intra_block(
      xd, seq_params->sb_size, seq_params->enable_intra_edge_filter, pd->width,
      pd->height, tx_size, mbmi->mode, 0, 0, FILTER_INTRA_MODES, src,
      src_stride, dst, dst_stride, blk_col, blk_row, plane);

  av1_subtract_txb(x, plane, plane_bsize, blk_col, blk_row, tx_size);
}